

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O1

shared_ptr<cab> __thiscall
cab_manager::find_cab(cab_manager *this,node_type src,node_type dst,uint32_t passengers)

{
  _Atomic_word *p_Var1;
  int iVar2;
  node_type nVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 *puVar5;
  pointer pnVar6;
  int iVar7;
  uint32_t uVar8;
  int32_t iVar9;
  long lVar10;
  mapped_type *__x;
  long lVar11;
  uint uVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  int in_R8D;
  uint uVar13;
  long lVar14;
  undefined8 *puVar15;
  pointer pnVar16;
  bool bVar17;
  shared_ptr<cab> sVar18;
  node_type current;
  node_type n;
  vector<node_type,_std::allocator<node_type>_> vec;
  deque<node_type,_std::allocator<node_type>_> queue;
  vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> cabs;
  _Deque_iterator<node_type,_node_type_&,_node_type_*> it;
  node_type local_13b;
  node_type local_13a;
  node_type local_139;
  cab_manager *local_138;
  uint local_130;
  uint32_t local_12c;
  cab *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  long local_108;
  vector<node_type,_std::allocator<node_type>_> local_100;
  _Deque_base<node_type,_std::allocator<node_type>_> local_e8;
  road_network *local_90;
  long local_88;
  map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
  *local_80;
  size_type *local_78;
  vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> local_70;
  undefined4 uStack_58;
  undefined4 uStack_54;
  cab *local_50 [4];
  
  local_108 = CONCAT71(in_register_00000031,src);
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_13b = dst;
  local_138 = this;
  local_12c = passengers;
  std::_Deque_base<node_type,_std::allocator<node_type>_>::_M_initialize_map(&local_e8,0);
  if ((cab *)local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (cab *)(local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
    std::deque<node_type,std::allocator<node_type>>::_M_push_back_aux<node_type_const&>
              ((deque<node_type,std::allocator<node_type>> *)&local_e8,&local_13b);
  }
  else {
    *(node_type *)(id_type *)local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_13b;
    local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         (_Elt_pointer)
         ((long)(id_type *)local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1);
  }
  local_80 = (map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
              *)(local_108 + 0x40);
  lVar14 = local_108 + 0x48;
  local_78 = &(local_138->_cabs)._M_h._M_bucket_count;
  local_90 = (road_network *)(local_108 + 0x70);
  local_130 = 0;
  local_88 = lVar14;
  do {
    if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0016638d;
    local_13a = (node_type)*(id_type *)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((cab *)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur ==
        (cab *)((long)local_e8._M_impl.super__Deque_impl_data._M_start._M_last + -1)) {
      operator_delete(local_e8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_e8._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_e8._M_impl.super__Deque_impl_data._M_start._M_last =
           (_Elt_pointer)
           &(((cab *)((long)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x1e0))->
            _route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
            super__Vector_impl_data._M_finish;
      local_e8._M_impl.super__Deque_impl_data._M_start._M_first =
           local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_e8._M_impl.super__Deque_impl_data._M_start._M_node =
           local_e8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)
           ((long)(id_type *)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1);
    }
    (local_138->_cabs)._M_h._M_buckets = (__buckets_ptr)0x0;
    (local_138->_cabs)._M_h._M_bucket_count = 0;
    lVar10 = lVar14;
    for (lVar11 = *(long *)(local_108 + 0x50); lVar11 != 0;
        lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar17 * 8)) {
      bVar17 = *(node_type *)(lVar11 + 0x20) < local_13a;
      if (!bVar17) {
        lVar10 = lVar11;
      }
    }
    lVar11 = lVar14;
    if ((lVar10 != lVar14) && (lVar11 = lVar10, local_13a < *(node_type *)(lVar10 + 0x20))) {
      lVar11 = lVar14;
    }
    if (lVar11 == lVar14) {
      bVar17 = true;
    }
    else {
      __x = std::
            map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
            ::operator[](local_80,&local_13a);
      std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::vector(&local_70,__x);
      puVar15 = (undefined8 *)
                CONCAT44(local_70.
                         super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_70.
                         super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
      puVar5 = (undefined8 *)
               CONCAT44(local_70.
                        super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                        local_70.
                        super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_4_);
      if (puVar15 == puVar5) {
        bVar17 = true;
      }
      else {
        uVar13 = 0x7fffffff;
        do {
          local_128 = (cab *)*puVar15;
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar15[1];
          _Stack_120._M_pi = p_Var4;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
            }
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              iVar7 = p_Var4->_M_use_count;
              do {
                if (iVar7 == 0) {
                  _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  break;
                }
                LOCK();
                iVar2 = p_Var4->_M_use_count;
                bVar17 = iVar7 == iVar2;
                if (bVar17) {
                  p_Var4->_M_use_count = iVar7 + 1;
                  iVar2 = iVar7;
                }
                iVar7 = iVar2;
                UNLOCK();
              } while (!bVar17);
            }
          }
          if (_Stack_120._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_128 = (cab *)0x0;
          }
          else if ((_Stack_120._M_pi)->_M_use_count == 0) {
            local_128 = (cab *)0x0;
          }
          uVar8 = cab::passengers_at_node(local_128,local_13b);
          if (uVar8 + in_R8D < 5) {
            iVar9 = cab::calculate_costs(local_128,local_13b,(node_type)local_12c);
            uVar8 = cab::costs(local_128);
            if (iVar9 - uVar8 < uVar13) {
              uVar8 = cab::costs(local_128);
              uVar13 = iVar9 - uVar8;
              (local_138->_cabs)._M_h._M_buckets = (__buckets_ptr)local_128;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_78,&_Stack_120);
            }
          }
          if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
          }
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &p_Var4->_M_weak_count;
              iVar7 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar7 = p_Var4->_M_weak_count;
              p_Var4->_M_weak_count = iVar7 + -1;
            }
            if (iVar7 == 1) {
              (*p_Var4->_vptr__Sp_counted_base[3])(p_Var4);
            }
          }
          puVar15 = puVar15 + 2;
        } while (puVar15 != puVar5);
        bVar17 = uVar13 == 0x7fffffff;
      }
      std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::~vector(&local_70);
      lVar14 = local_88;
    }
    iVar7 = 1;
    if (bVar17) {
      road_network::get_predecessors(&local_100,local_90,local_13a);
      pnVar6 = local_100.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pnVar16 = local_100.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
                     super__Vector_impl_data._M_start; pnVar16 != pnVar6; pnVar16 = pnVar16 + 1) {
        local_139 = *pnVar16;
        local_70.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ =
             local_e8._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_;
        local_70.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ =
             local_e8._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_;
        local_70.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ =
             local_e8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_;
        local_70.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ =
             local_e8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_;
        local_70.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             local_e8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_;
        local_70.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             local_e8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_;
        uStack_58 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node._0_4_;
        uStack_54 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node._4_4_;
        local_128 = (cab *)local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        _Stack_120._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        local_118 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_;
        uStack_114 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_;
        uStack_110 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_;
        uStack_10c = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_;
        std::
        __find_if<std::_Deque_iterator<node_type,node_type&,node_type*>,__gnu_cxx::__ops::_Iter_equals_val<node_type_const>>
                  (local_50,&local_70,&local_128,&local_139);
        if (local_50[0] == (cab *)local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          if ((cab *)local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              (cab *)(local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
            std::deque<node_type,std::allocator<node_type>>::_M_push_back_aux<node_type_const&>
                      ((deque<node_type,std::allocator<node_type>> *)&local_e8,&local_139);
          }
          else {
            *(node_type *)(id_type *)local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_139;
            local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 (_Elt_pointer)
                 ((long)(id_type *)local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1);
          }
        }
      }
      nVar3 = (node_type)*(id_type *)local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((nVar3 != local_13b) || (iVar7 = 3, (local_130 & 1) == 0)) {
        uVar12 = local_130 & 0xff;
        uVar13 = 1;
        if ((local_130 & 1) != 0) {
          uVar13 = uVar12;
        }
        local_130 = uVar13;
        if (nVar3 != local_13b) {
          local_130 = uVar12;
        }
        iVar7 = 0;
      }
      if (local_100.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_100.super__Vector_base<node_type,_std::allocator<node_type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_100.super__Vector_base<node_type,_std::allocator<node_type>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((bVar17) &&
       (p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (local_138->_cabs)._M_h._M_bucket_count,
       p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  } while (iVar7 == 0);
  if (iVar7 == 3) {
LAB_0016638d:
    (local_138->_cabs)._M_h._M_buckets = (__buckets_ptr)0x0;
    (local_138->_cabs)._M_h._M_bucket_count = 0;
  }
  std::_Deque_base<node_type,_std::allocator<node_type>_>::~_Deque_base(&local_e8);
  sVar18.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar18.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_138;
  return (shared_ptr<cab>)sVar18.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cab> cab_manager::find_cab(node_type src, node_type dst, std::uint32_t passengers)
{
    bool cycle = false;
    std::deque<node_type> queue;
    queue.push_back(src);

    while(!queue.empty())
    {
        node_type current = queue.front();
        queue.pop_front();

        std::int32_t min = INT32_MAX;
        std::shared_ptr<cab> chosen = nullptr;
        if(_cabs_at_node.find(current) != _cabs_at_node.end())
        {
            std::vector<std::weak_ptr<cab>> cabs = _cabs_at_node[current];
            for(auto cab : cabs)
            {
                auto shared = cab.lock();
                if(shared->passengers_at_node(src) + passengers > 4)
                {
                    continue;
                }

                // calculate cost
                std::int32_t cost = shared->calculate_costs(src, dst);
                if((cost - shared->costs()) < min)
                {
                    min = cost - shared->costs();
                    chosen = shared;
                }
            }
        }

        if(min != INT32_MAX)
        {
            return chosen;
        }

        std::vector<node_type> vec = _rnet.get_predecessors(current);
        for(auto n : vec)
        {
            auto it = std::find(queue.begin(), queue.end(), n);
            if(it == queue.end())
            {
                queue.push_back(n);
            }
        }

        // break after two cycles due to edge case src = P4
        if(queue.front() == src && cycle)
        {
            break;
        }
        else if (queue.front() == src && !cycle)
        {
            cycle = true;
        }
        
    }
    return nullptr;
}